

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_recovery.cc
# Opt level: O3

void __thiscall
ClockRecovery::work(ClockRecovery *this,
                   shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *qin,shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                        *qout)

{
  Samples *pSVar1;
  _ComplexT _Var2;
  pointer pcVar3;
  iterator __position;
  SamplePublisher *this_00;
  _ComplexT _Var4;
  int iVar5;
  ulong uVar6;
  pointer pcVar7;
  long lVar8;
  size_t __n;
  ulong uVar9;
  pointer pcVar10;
  float fVar11;
  float fVar12;
  _ComplexT _Var13;
  float fVar15;
  float fVar16;
  undefined8 uVar14;
  undefined8 extraout_XMM0_Qb;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined4 uVar21;
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_60;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_58 [3];
  float fStack_40;
  float fStack_3c;
  
  iVar5 = (int)(qin->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
            ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
             local_68);
  if (local_68 == (undefined1  [8])0x0) {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::close
              ((qout->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,iVar5);
  }
  else {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
              ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
               local_70);
    pSVar1 = &this->tmp_;
    std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::complex<float>*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>
              ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)pSVar1,
               (this->tmp_).
               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)local_68,
               *(pointer *)((long)local_68 + 8));
    local_58[0]._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_68;
    local_68 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
              ((qin->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,local_58);
    if (local_58[0]._M_t.
        super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         )0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)local_58,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                   local_58[0]._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl);
    }
    local_58[0]._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
            )0x0;
    pcVar3 = (this->tmp_).
             super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar10 = (this->tmp_).
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
    uVar9 = (long)pcVar10 - (long)pcVar3 >> 3;
    if (*(pointer *)((long)local_70 + 8) != *(pointer *)local_70) {
      *(pointer *)((long)local_70 + 8) = *(pointer *)local_70;
    }
    fVar11 = (float)uVar9 / this->omega_;
    uVar6 = (ulong)fVar11;
    local_58[1]._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )qout;
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::reserve
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70,
               (long)(fVar11 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6);
    if (pcVar10 != pcVar3) {
      fVar11 = this->mu_;
      uVar6 = 0;
      do {
        iVar5 = (int)fVar11;
        if (uVar9 <= (long)iVar5 + uVar6 + 7) break;
        uVar6 = uVar6 + (long)iVar5;
        pcVar3 = (pSVar1->
                 super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        this->mu_ = fVar11 - (float)iVar5;
        _Var13 = 0;
        lVar8 = 0;
        do {
          _Var2 = pcVar3[uVar6 + lVar8]._M_value;
          fVar12 = (float)_Var13 +
                   mmseTaps[(int)((fVar11 - (float)iVar5) * 128.0)][lVar8] * (float)_Var2;
          fVar15 = (float)(_Var13 >> 0x20) +
                   mmseTaps[(int)((fVar11 - (float)iVar5) * 128.0)][lVar8] * (float)(_Var2 >> 0x20);
          _Var13 = CONCAT44(fVar15,fVar12);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        _Var2 = (this->p1t_)._M_value;
        _Var4 = (this->c1t_)._M_value;
        (this->p1t_)._M_value = (this->p0t_)._M_value;
        (this->p2t_)._M_value = _Var2;
        (this->p0t_)._M_value = _Var13;
        (this->c1t_)._M_value = (this->c0t_)._M_value;
        (this->c2t_)._M_value = _Var4;
        (this->c0t_)._M_value =
             CONCAT44(-(uint)(0.0 < fVar15),-(uint)(0.0 < fVar12)) & 0x3f8000003f800000;
        __position._M_current = *(complex<float> **)((long)local_70 + 8);
        if (__position._M_current == *(complex<float> **)((long)local_70 + 0x10)) {
          std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
          _M_realloc_insert<std::complex<float>const&>
                    ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)local_70,
                     __position,&this->p0t_);
        }
        else {
          (__position._M_current)->_M_value = (this->p0t_)._M_value;
          *(long *)((long)local_70 + 8) = *(long *)((long)local_70 + 8) + 8;
        }
        _Var13 = (this->p1t_)._M_value;
        fVar18 = (float)_Var13;
        fVar19 = (float)(_Var13 >> 0x20);
        _Var13 = (this->c0t_)._M_value;
        _Var2 = (this->c2t_)._M_value;
        fVar15 = (float)_Var13 - (float)_Var2;
        fVar16 = (float)(_Var13 >> 0x20) - (float)(_Var2 >> 0x20);
        fVar17 = fVar16 * fVar19;
        uVar21 = fVar17 + fVar15 * fVar18;
        fVar11 = fVar17;
        fVar12 = fVar17;
        if ((NAN((float)uVar21)) && (NAN(fVar16 * fVar18 - fVar15 * fVar19))) {
          uVar14 = __mulsc3(CONCAT44(fVar16,fVar15),fVar16,fVar18,-fVar19);
          uVar21 = (undefined4)uVar14;
          fVar17 = (float)((ulong)uVar14 >> 0x20);
          fVar11 = (float)extraout_XMM0_Qb;
          fVar12 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
        }
        _Var13 = (this->p0t_)._M_value;
        _Var2 = (this->p2t_)._M_value;
        fVar19 = (float)_Var13 - (float)_Var2;
        fVar20 = (float)(_Var13 >> 0x20) - (float)(_Var2 >> 0x20);
        _Var13 = (this->c1t_)._M_value;
        fVar16 = (float)_Var13;
        fVar18 = (float)(_Var13 >> 0x20);
        fVar15 = fVar20 * fVar18 + fVar19 * fVar16;
        if ((NAN(fVar15)) && (NAN(fVar20 * fVar16 - fVar19 * fVar18))) {
          local_58[2]._M_t.
          super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
          .
          super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
          ._M_head_impl._0_4_ = uVar21;
          local_58[2]._M_t.
          super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
          .
          super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
          ._M_head_impl._4_4_ = fVar17;
          fStack_40 = fVar11;
          fStack_3c = fVar12;
          fVar15 = (float)__mulsc3(CONCAT44(fVar20,fVar19),fVar20,fVar16,-fVar18);
          uVar21 = local_58[2]._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl._0_4_;
        }
        fVar12 = (ABS((fVar15 - (float)uVar21) + 1.0) - ABS((fVar15 - (float)uVar21) + -1.0)) * 0.5;
        fVar15 = this->omegaGain_ * fVar12 + this->omega_;
        this->omega_ = fVar15;
        fVar11 = this->omegaMax_;
        if ((fVar15 < this->omegaMin_) || (fVar11 = this->omegaMin_, this->omegaMax_ < fVar15)) {
          fVar15 = fVar11;
          this->omega_ = fVar15;
        }
        fVar11 = fVar12 * this->muGain_ + fVar15 + this->mu_;
        this->mu_ = fVar11;
      } while (uVar6 < uVar9);
      if (uVar6 != 0) {
        pcVar10 = (pSVar1->
                  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar3 = pcVar10 + uVar6;
        __n = (long)(this->tmp_).
                    super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pcVar3;
        pcVar7 = pcVar3;
        if (__n != 0) {
          memmove(pcVar10,pcVar3,__n);
          pcVar7 = (this->tmp_).
                   super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        pcVar10 = (pointer)((long)pcVar10 + ((long)pcVar7 - (long)pcVar3));
        if (pcVar7 != pcVar10) {
          (this->tmp_).
          super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar10;
        }
      }
    }
    this_00 = (this->samplePublisher_)._M_t.
              super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
              super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
              super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
    if (this_00 != (SamplePublisher *)0x0) {
      SamplePublisher::publish(this_00,(Samples *)local_70);
    }
    local_60._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_70;
    local_70 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
              (((__shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)local_58[1]._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl)->_M_ptr,&local_60);
    if (local_60._M_t.
        super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         )0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)&local_60,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                   local_60._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl);
    }
    local_60._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
            )0x0;
    if (local_70 != (undefined1  [8])0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)local_70,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70);
    }
  }
  if (local_68 != (undefined1  [8])0x0) {
    std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::
    operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)local_68,
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_68);
  }
  return;
}

Assistant:

void ClockRecovery::work(
    const std::shared_ptr<Queue<Samples> >& qin,
    const std::shared_ptr<Queue<Samples> >& qout) {
  auto input = qin->popForRead();
  if (!input) {
    qout->close();
    return;
  }

  auto output = qout->popForWrite();
  tmp_.insert(tmp_.end(), input->begin(), input->end());

  // Return read buffer (it has been copied into tmp_)
  qin->pushRead(std::move(input));

  // Omega is number of samples per symbol, so this
  // estimates the number of symbols we should find in this call.
  auto nsamples = tmp_.size();
  output->clear();
  output->reserve(nsamples / omega_);

  // Process 1 sample per iteration.
  // This does not allow vectorization but is more stable than the
  // vectorized implementation (see git history of this file).
  // It is roughly 15% slower than previous implementation.
  size_t i = 0;
  while (i < nsamples) {
    float muf;
    int mui;
    const std::complex<float>* s;

    // Populate phase and sample pointer
    muf = (float) mu_;
    mui = (int) mu_;
    s = &tmp_[i + mui];

    // Check that we don't go out of range
    if ((i + mui + 7) >= nsamples) {
      break;
    }

    // In range; update sample index and phase
    i += mui;
    mu_ -= mui;

    // Normalize mu to [0.0, 1.0) so we can use it to
    // choose the right interpolation filter.
    muf = muf - (float) mui;

    // Run interpolator to get interpolated samples at offset mu
    std::complex<float> acc = 0.0f;
    const auto taps = mmseTaps[(int) (muf * 128.0f)];
    for (auto k = 0; k < NUM_TAPS; k++) {
      acc += taps[k] * s[k];
    }

    // Push down sample
    p2t_ = p1t_;
    p1t_ = p0t_;
    p0t_ = acc;

    // Push down associated complex quadrant
    c2t_ = c1t_;
    c1t_ = c0t_;
    c0t_.real((p0t_.real() > 0.0f ? 1.0f : 0.0f));
    c0t_.imag((p0t_.imag() > 0.0f ? 1.0f : 0.0f));

    // Use interpolated sample as output
    // Then use the estimated error to update omega_ and mu_
    output->push_back(p0t_);

    // Compute error
    std::complex<float> x = (c0t_ - c2t_) * std::conj(p1t_);
    std::complex<float> y = (p0t_ - p2t_) * std::conj(c1t_);
    std::complex<float> u = y - x;

    // Clip error to [-1.0, 1.0]
    float mm = u.real();
    mm = 0.5f * (fabsf(mm + 1.0f) - fabsf(mm - 1.0f));

    // Update omega
    omega_ += omegaGain_ * mm;

    // Wrap omega if it hits the lower or upper bound.
    // If the algorithm is biased to always increase omega at a
    // certain point, it will wrap and start from minimum, in the
    // hope it locks on to the signal again.
    if (omega_ < omegaMin_) {
      omega_ = omegaMax_;
    }
    if (omega_ > omegaMax_) {
      omega_ = omegaMin_;
    }

    // Update mu with new omega
    // It is OK if this is bigger than 1.0 because that means
    // we need to skip a few samples in the next iteration.
    mu_ += omega_ + muGain_ * mm;
  }

  // Index i was not used yet. Copy the sample at index i and
  // everything after it to the beginning of the sample buffer.
  tmp_.erase(tmp_.begin(), tmp_.begin() + i);

  // Publish output if applicable
  if (samplePublisher_) {
    samplePublisher_->publish(*output);
  }

  // Return output buffer
  qout->pushWrite(std::move(output));
}